

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void server::localconnect(int n)

{
  uint uVar1;
  clientinfo *ci;
  clientinfo *local_18;
  
  if (n < 0x80) {
    local_18 = (clientinfo *)getclientinfo(n);
  }
  else if (n + -0x80 < DAT_00194cc4) {
    local_18 = *(clientinfo **)(bots + (long)(n + -0x80) * 8);
  }
  else {
    local_18 = (clientinfo *)0x0;
  }
  privilegemsg(1,"\f7Connected from host IP");
  local_18->ownernum = n;
  local_18->clientnum = n;
  local_18->connectmillis = totalmillis;
  uVar1 = randomMT();
  local_18->sessionid = (totalmillis % 10000 + 1) * uVar1 & 0xffffff;
  local_18->local = true;
  vector<server::clientinfo_*>::add((vector<server::clientinfo_*> *)&connects,&local_18);
  sendservinfo(local_18);
  return;
}

Assistant:

void localconnect(int n)
    {
        clientinfo *ci = getinfo(n);
        privilegemsg(PRIV_MASTER, "\f7Connected from host IP");
        ci->clientnum = ci->ownernum = n;
        ci->connectmillis = totalmillis;
        ci->sessionid = (rnd(0x1000000)*((totalmillis%10000)+1))&0xFFFFFF;
        ci->local = true;
        connects.add(ci);
        sendservinfo(ci);
    }